

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O2

void __thiscall
jetbrains::teamcity::TeamcityMessages::testFinished
          (TeamcityMessages *this,string *name,unsigned_long durationMs,string *flowId)

{
  string *value;
  RaiiMessage msg;
  string local_200;
  string local_1e0 [32];
  string local_1c0;
  stringstream out;
  undefined1 local_190 [376];
  
  anon_unknown_1::RaiiMessage::RaiiMessage(&msg,"testFinished",this->m_out);
  std::__cxx11::string::string((string *)&local_1c0,(string *)name);
  anon_unknown_1::RaiiMessage::writeProperty(&msg,"name",&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::string(local_1e0,(string *)flowId);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&msg,(char *)local_1e0,value);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::stringstream::stringstream((stringstream *)&out,_S_out);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  anon_unknown_1::RaiiMessage::writeProperty(&msg,"duration",&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  anon_unknown_1::RaiiMessage::~RaiiMessage(&msg);
  return;
}

Assistant:

void TeamcityMessages::testFinished(const std::string& name, const unsigned long durationMs, const std::string& flowId)
{
    RaiiMessage msg("testFinished", *m_out);

    msg.writeProperty("name", name);
    msg.writePropertyIfNonEmpty("flowId", flowId);

    /// \bug W/ some locales it is possible to get a number w/ a number separator(s)!
    /// \todo Make a test for that!
    std::stringstream out(std::ios_base::out);
    out << durationMs;
    msg.writeProperty("duration", out.str());
}